

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::shiftDown(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,size_t idx)

{
  byte bVar1;
  Node *pNVar2;
  pointer __p;
  Node *pNVar3;
  pointer pcVar4;
  long lVar5;
  uint8_t *puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  InfoType IVar8;
  
  puVar6 = this->mInfo;
  bVar1 = puVar6[idx + 1];
  IVar8 = this->mInfoInc;
  if (IVar8 * 2 <= (uint)bVar1) {
    lVar5 = idx * 0x28;
    do {
      puVar6[idx] = bVar1 - (char)IVar8;
      pNVar2 = this->mKeyVals;
      std::__cxx11::string::operator=
                ((string *)((long)&(pNVar2->mData).first._M_dataplus._M_p + lVar5),
                 (string *)((long)&pNVar2[1].mData.first._M_dataplus._M_p + lVar5));
      __p = *(pointer *)
             ((long)&pNVar2[1].mData.second._M_t.
                     super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>
             + lVar5);
      *(undefined8 *)
       ((long)&pNVar2[1].mData.second._M_t.
               super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>._M_t.
               super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_> +
       lVar5) = 0;
      std::__uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>::reset
                ((__uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_> *)
                 ((long)&(pNVar2->mData).second._M_t.
                         super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>
                 + lVar5),__p);
      puVar6 = this->mInfo;
      bVar1 = puVar6[idx + 2];
      IVar8 = this->mInfoInc;
      idx = idx + 1;
      lVar5 = lVar5 + 0x28;
    } while (IVar8 * 2 <= (uint)bVar1);
  }
  puVar6[idx] = '\0';
  pNVar3 = this->mKeyVals;
  pNVar2 = pNVar3 + idx;
  std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>::~unique_ptr
            (&(pNVar2->mData).second);
  pcVar4 = (pNVar2->mData).first._M_dataplus._M_p;
  paVar7 = &pNVar3[idx].mData.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar7) {
    operator_delete(pcVar4,paVar7->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

void shiftDown(size_t idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        // until we find one that is either empty or has zero offset.
        // TODO(martinus) we don't need to move everything, just the last one for the same
        // bucket.
        mKeyVals[idx].destroy(*this);

        // until we find one that is either empty or has zero offset.
        while (mInfo[idx + 1] >= 2 * mInfoInc) {
            ROBIN_HOOD_COUNT(shiftDown)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx + 1] - mInfoInc);
            mKeyVals[idx] = std::move(mKeyVals[idx + 1]);
            ++idx;
        }

        mInfo[idx] = 0;
        // don't destroy, we've moved it
        // mKeyVals[idx].destroy(*this);
        mKeyVals[idx].~Node();
    }